

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O3

unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> __thiscall
pfederc::Parser::parseFunctionBody(Parser *this)

{
  TokenType TVar1;
  pointer pcVar2;
  istream *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined7 extraout_var;
  Lexer *pLVar7;
  undefined7 extraout_var_00;
  Lexer *pLVar8;
  Token *pTVar9;
  pointer *__ptr;
  ReturnControlType rct;
  Parser *in_RSI;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> returnExpr;
  Exprs exprs;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  _Alloc_hider _Stack_70;
  _Base_ptr local_68;
  Exprs local_58;
  
  pTVar9 = in_RSI->lexer->currentToken;
  local_88._16_8_ = (pTVar9->pos).line;
  _Stack_70._M_p = (pointer)(pTVar9->pos).startIndex;
  local_68 = (_Base_ptr)(pTVar9->pos).endIndex;
  local_58.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar7 = this->lexer;
  bVar6 = Token::operator!=(pTVar9,TOK_KW_RET);
  if (bVar6) {
    local_a8._12_4_ = 0;
    do {
      while( true ) {
        bVar6 = Token::operator!=(in_RSI->lexer->currentToken,TOK_STMT);
        if (((!bVar6) || (bVar6 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOF), !bVar6))
           || (bVar6 = Token::operator!=(in_RSI->lexer->currentToken,TOK_KW_ELSE), !bVar6))
        goto LAB_00116467;
        bVar6 = Token::operator==(in_RSI->lexer->currentToken,TOK_EOL);
        if (!bVar6) break;
        Lexer::next(in_RSI->lexer);
        bVar6 = Token::operator!=(in_RSI->lexer->currentToken,TOK_KW_RET);
        if (!bVar6) goto LAB_00116467;
      }
      parseExpression((Parser *)local_a8,(Precedence)in_RSI);
      bVar6 = Token::operator!=(in_RSI->lexer->currentToken,TOK_STMT);
      if ((!bVar6) || (bVar6 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOL), !bVar6)) {
        bVar6 = Token::operator==(in_RSI->lexer->currentToken,TOK_STMT);
        if ((!bVar6) || ((Lexer *)local_a8._0_8_ == (Lexer *)0x0)) goto LAB_001163bf;
        Position::operator+((Position *)(local_88 + 0x10),(Position *)(local_a8._0_8_ + 0x20));
        local_68 = (_Base_ptr)local_88._0_8_;
        local_88._16_8_ = local_98._0_8_;
        _Stack_70._M_p = (pointer)local_98._8_8_;
        pLVar8 = in_RSI->lexer;
        pLVar7 = (Lexer *)operator_new(0x60);
        BodyExpr::BodyExpr((BodyExpr *)pLVar7,pLVar8,(Position *)(local_88 + 0x10),&local_58,
                           (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                           local_a8,RETURN);
        if ((_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_a8._0_8_
            != (Expr *)0x0) {
          bVar6 = false;
          goto LAB_00116419;
        }
LAB_001166cb:
        this->lexer = pLVar7;
        goto LAB_001166af;
      }
      pTVar9 = in_RSI->lexer->currentToken;
      local_98._0_8_ = operator_new(0x38);
      pcVar2 = (pointer)(pTVar9->pos).endIndex;
      *(Level *)&((Lexer *)local_98._0_8_)->_vptr_Lexer = LVL_ERROR;
      *(SyntaxErrorCode *)((long)&((Lexer *)local_98._0_8_)->_vptr_Lexer + 4) = STX_ERR_EXPECTED_EOL
      ;
      piVar3 = (istream *)(pTVar9->pos).startIndex;
      ((Position *)&((Lexer *)local_98._0_8_)->cfg)->line = (pTVar9->pos).line;
      ((Lexer *)local_98._0_8_)->input = piVar3;
      (((Lexer *)local_98._0_8_)->filePath)._M_dataplus._M_p = pcVar2;
      (((Lexer *)local_98._0_8_)->filePath)._M_string_length = 0;
      (((Lexer *)local_98._0_8_)->filePath).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(((Lexer *)local_98._0_8_)->filePath).field_2 + 8) = 0;
      generateError((Parser *)&stack0xffffffffffffffc8,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 &stack0xffffffffffffffc8);
      if ((Lexer *)local_98._0_8_ != (Lexer *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_98,
                   (Error<pfederc::SyntaxErrorCode> *)local_98._0_8_);
      }
      skipToStmtEol(in_RSI);
      local_a8._12_4_ = (undefined4)CONCAT71(extraout_var,1);
LAB_001163bf:
      expect(in_RSI,TOK_EOL);
      if ((Lexer *)local_a8._0_8_ == (Lexer *)0x0) {
        local_a8._12_4_ = (undefined4)CONCAT71(extraout_var_00,1);
      }
      else {
        Position::operator+((Position *)(local_88 + 0x10),(Position *)(local_a8._0_8_ + 0x20));
        local_68 = (_Base_ptr)local_88._0_8_;
        local_88._16_8_ = local_98._0_8_;
        _Stack_70._M_p = (pointer)local_98._8_8_;
        std::
        vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
        ::emplace_back<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
                    *)&local_58,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_a8);
        bVar6 = true;
        if ((Lexer *)local_a8._0_8_ != (Lexer *)0x0) {
LAB_00116419:
          (**(code **)(*(long *)local_a8._0_8_ + 8))();
          if (!bVar6) goto LAB_001166cb;
        }
      }
      bVar6 = Token::operator!=(in_RSI->lexer->currentToken,TOK_KW_RET);
    } while (bVar6);
  }
  else {
    local_a8._12_4_ = 0;
  }
LAB_00116467:
  this->lexer = pLVar7;
  local_a8._0_8_ = (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0;
  bVar6 = Token::operator==(in_RSI->lexer->currentToken,TOK_KW_RET);
  if ((bVar6) || (bVar6 = Token::operator==(in_RSI->lexer->currentToken,TOK_KW_CTN), bVar6)) {
LAB_001164c0:
    pTVar9 = in_RSI->lexer->currentToken;
    TVar1 = pTVar9->type;
    if (TVar1 == TOK_KW_RET) {
      rct = RETURN;
      bVar6 = true;
    }
    else {
      if (TVar1 == TOK_KW_BRK) {
        rct = BREAK;
      }
      else {
        if (TVar1 != TOK_KW_CTN) {
          local_98._0_8_ = (Lexer *)local_88;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"Return control is neither ret, ctn or brk.","");
          fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_func.cpp"
                ,0x163,(string *)local_98);
          if ((Lexer *)local_98._0_8_ != (Lexer *)local_88) {
            operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
          }
          pTVar9 = in_RSI->lexer->currentToken;
          bVar6 = false;
          rct = NONE;
          goto LAB_00116557;
        }
        rct = CONTINUE;
      }
      bVar6 = false;
    }
LAB_00116557:
    Position::operator+((Position *)(local_88 + 0x10),&pTVar9->pos);
    local_68 = (_Base_ptr)local_88._0_8_;
    local_88._16_8_ = local_98._0_8_;
    _Stack_70._M_p = (pointer)local_98._8_8_;
    Lexer::next(in_RSI->lexer);
    if ((!bVar6) &&
       (((bVar6 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOF), !bVar6 ||
         (bVar6 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOL), !bVar6)) ||
        (bVar6 = Token::operator!=(in_RSI->lexer->currentToken,TOK_STMT), !bVar6))))
    goto LAB_00116656;
    parseExpression((Parser *)local_98,(Precedence)in_RSI);
    uVar5 = local_98._0_8_;
    uVar4 = local_a8._0_8_;
    local_98._0_8_ = (Lexer *)0x0;
    local_a8._0_8_ = uVar5;
    if (((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)uVar4 !=
         (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) &&
       ((**(code **)(*(long *)uVar4 + 8))(), (Lexer *)local_98._0_8_ != (Lexer *)0x0)) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
    if ((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)uVar5 !=
        (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
      Position::operator+((Position *)(local_88 + 0x10),(Position *)(uVar5 + 0x20));
      local_68 = (_Base_ptr)local_88._0_8_;
      local_88._16_8_ = local_98._0_8_;
      _Stack_70._M_p = (pointer)local_98._8_8_;
      goto LAB_00116656;
    }
    skipEol(in_RSI);
  }
  else {
    bVar6 = Token::operator==(in_RSI->lexer->currentToken,TOK_KW_BRK);
    rct = NONE;
    if (bVar6) goto LAB_001164c0;
LAB_00116656:
    skipEol(in_RSI);
    if ((local_a8._12_4_ & 1) == 0) {
      pLVar7 = in_RSI->lexer;
      pLVar8 = (Lexer *)operator_new(0x60);
      BodyExpr::BodyExpr((BodyExpr *)pLVar8,pLVar7,(Position *)(local_88 + 0x10),&local_58,
                         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_a8,
                         rct);
      goto LAB_0011669d;
    }
  }
  pLVar8 = (Lexer *)0x0;
LAB_0011669d:
  this->lexer = pLVar8;
  if ((Lexer *)local_a8._0_8_ != (Lexer *)0x0) {
    (*(*(_func_int ***)local_a8._0_8_)[1])();
  }
LAB_001166af:
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector(&local_58);
  return (__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>)
         (__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<BodyExpr> Parser::parseFunctionBody() noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  bool err = false;
  Exprs exprs;
  while (*lexer.getCurrentToken() != TokenType::TOK_KW_RET
      && *lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF
      && *lexer.getCurrentToken() != TokenType::TOK_KW_ELSE) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (*lexer.getCurrentToken() != TokenType::TOK_STMT
        && *lexer.getCurrentToken() != TokenType::TOK_EOL) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      skipToStmtEol();
      err = true;
    } else if (*lexer.getCurrentToken() == TokenType::TOK_STMT && expr) {
      pos = pos + expr->getPosition();
      // return expression without mentioning return ('expr' ';')
      return std::make_unique<BodyExpr>(lexer, pos,
          std::move(exprs), std::move(expr),
          ReturnControlType::RETURN);
    }

    expect(TokenType::TOK_EOL);

    if (!expr)
      err = true;
    else {
      pos = pos + expr->getPosition();
      exprs.push_back(std::move(expr));
    }
  }

  std::unique_ptr<Expr> returnExpr;
  ReturnControlType rct{ReturnControlType::NONE};
  if (*lexer.getCurrentToken() == TokenType::TOK_KW_RET
      || *lexer.getCurrentToken() == TokenType::TOK_KW_CTN
      || *lexer.getCurrentToken() == TokenType::TOK_KW_BRK) {
    switch (lexer.getCurrentToken()->getType()) {
    case TokenType::TOK_KW_RET:
      rct = ReturnControlType::RETURN;
      break;
    case TokenType::TOK_KW_CTN:
      rct = ReturnControlType::CONTINUE;
      break;
    case TokenType::TOK_KW_BRK:
      rct = ReturnControlType::BREAK;
      break;
    default:
      fatal(__FILE__, __LINE__, "Return control is neither ret, ctn or brk.");
      break;
    }

    pos = pos + lexer.getCurrentToken()->getPosition();
    lexer.next(); // eat return,ctn,brk

    if (rct == ReturnControlType::RETURN
        || (*lexer.getCurrentToken() != TokenType::TOK_EOF
            && *lexer.getCurrentToken() != TokenType::TOK_EOL
            && *lexer.getCurrentToken() != TokenType::TOK_STMT)) {
      returnExpr = parseExpression();
      if (returnExpr)
        pos = pos + returnExpr->getPosition();
      else
        err = true;
    }
  }

  skipEol();

  if (err)
    return nullptr;

  return std::make_unique<BodyExpr>(lexer,
    pos, std::move(exprs), std::move(returnExpr), rct);
}